

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

string * google::protobuf::internal::NameOfEnum_abi_cxx11_(EnumDescriptor *descriptor,int value)

{
  EnumValueDescriptor *this;
  undefined8 local_28;
  EnumValueDescriptor *d;
  int value_local;
  EnumDescriptor *descriptor_local;
  
  this = EnumDescriptor::FindValueByNumber(descriptor,value);
  if (this == (EnumValueDescriptor *)0x0) {
    local_28 = GetEmptyString_abi_cxx11_();
  }
  else {
    local_28 = EnumValueDescriptor::name_abi_cxx11_(this);
  }
  return local_28;
}

Assistant:

const string& NameOfEnum(const EnumDescriptor* descriptor, int value) {
  const EnumValueDescriptor* d = descriptor->FindValueByNumber(value);
  return (d == NULL ? GetEmptyString() : d->name());
}